

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall Am_Object_Data::~Am_Object_Data(Am_Object_Data *this)

{
  Am_Object_Data *this_local;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00410820;
  Am_Wrapper::Note_Reference(&this->super_Am_Wrapper);
  if ((this->data).data != (char *)0x0) {
    destroy_object(this);
  }
  (this->part_slot).super_Am_Value.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Slot_Data::~Am_Slot_Data(&this->part_slot);
  Am_Slot_Data::~Am_Slot_Data(&this->owner_slot);
  Am_Demon_Queue::~Am_Demon_Queue(&this->demon_queue);
  Am_Wrapper::~Am_Wrapper(&this->super_Am_Wrapper);
  return;
}

Assistant:

Am_Object_Data::~Am_Object_Data()
{
// all special debug actions have to take place before we delete
// anything from this object !!
#ifdef DEBUG
  const char *name = Am_Get_Name_Of_Item(this);

#ifdef LEAK_TRACE
  if (name != nullptr) {
    std::cout << name << "\t\tdestroyed: " << this
              << "\tReferences: " << Ref_Count() << std::endl;
  } else {
    std::cout << "NO-LONGER-NAMED\t\tdestroyed: " << this
              << "\tReferences: " << Ref_Count() << std::endl;
  }
#endif

  Am_Unregister_Name(this);
  delete[] name;
#endif

  Note_Reference();

  if (data.data) {
    destroy_object();
  }

  part_slot.value.wrapper_value = nullptr;
}